

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::GenerateDescriptors
          (SharedCodeGenerator *this,Printer *printer)

{
  _Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false> this_00;
  FileDescriptor *pFVar1;
  FileDescriptor *file;
  ulong uVar2;
  int index;
  char *text;
  int i;
  long lVar3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dependencies;
  string full_name;
  string filename;
  string file_data;
  string classname;
  string package;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  FileDescriptorProto file_proto;
  
  FileDescriptorProto::FileDescriptorProto(&file_proto);
  FileDescriptor::CopyTo(this->file_,&file_proto);
  file_data._M_dataplus._M_p = (pointer)&file_data.field_2;
  file_data._M_string_length = 0;
  file_data.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&file_proto,&file_data);
  io::Printer::Print<>(printer,"java.lang.String[] descriptorData = {\n");
  io::Printer::Indent(printer);
  uVar2 = 0;
  while( true ) {
    if (file_data._M_string_length <= uVar2) break;
    if (uVar2 != 0) {
      text = ",\n";
      if ((int)((uVar2 & 0xffffffff) / 16000) * -16000 + (int)uVar2 != 0) {
        text = " +\n";
      }
      io::Printer::Print<>(printer,text);
    }
    std::__cxx11::string::substr((ulong)&filename,(ulong)&file_data);
    CEscape(&local_168.first,&filename);
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,"\"$data$\"",(char (*) [5])0x39e7b5,&local_168.first);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&filename);
    uVar2 = uVar2 + 0x28;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"\n};\n");
  dependencies.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dependencies.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dependencies.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (index = 0; index < *(int *)(this->file_ + 0x20); index = index + 1) {
    pFVar1 = FileDescriptor::dependency(this->file_,index);
    std::__cxx11::string::string((string *)&filename,*(string **)pFVar1);
    pFVar1 = FileDescriptor::dependency(this->file_,index);
    FileJavaPackage_abi_cxx11_(&package,(java *)pFVar1,file);
    this_00._M_head_impl =
         (this->name_resolver_)._M_t.
         super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
         .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>.
         _M_head_impl;
    pFVar1 = FileDescriptor::dependency(this->file_,index);
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_(&classname,this_00._M_head_impl,pFVar1);
    full_name._M_dataplus._M_p = (pointer)&full_name.field_2;
    full_name._M_string_length = 0;
    full_name.field_2._M_local_buf[0] = '\0';
    if (package._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&full_name);
    }
    else {
      std::operator+(&local_128,&package,".");
      std::operator+(&local_168.first,&local_128,&classname);
      std::__cxx11::string::operator=((string *)&full_name,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_128);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_168,&filename,&full_name);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&dependencies,&local_168);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_168);
    std::__cxx11::string::~string((string *)&full_name);
    std::__cxx11::string::~string((string *)&classname);
    std::__cxx11::string::~string((string *)&package);
    std::__cxx11::string::~string((string *)&filename);
  }
  io::Printer::Print<>
            (printer,
             "descriptor = com.google.protobuf.Descriptors.FileDescriptor\n  .internalBuildGeneratedFileFrom(descriptorData,\n"
            );
  io::Printer::Print<>(printer,"    new com.google.protobuf.Descriptors.FileDescriptor[] {\n");
  lVar3 = 0x20;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)dependencies.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)dependencies.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 6); uVar2 = uVar2 + 1) {
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,"      $dependency$.getDescriptor(),\n",(char (*) [11])"dependency",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&((dependencies.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p + lVar3
               ));
    lVar3 = lVar3 + 0x40;
  }
  io::Printer::Print<>(printer,"    });\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&dependencies);
  std::__cxx11::string::~string((string *)&file_data);
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  return;
}

Assistant:

void SharedCodeGenerator::GenerateDescriptors(io::Printer* printer) {
  // Embed the descriptor.  We simply serialize the entire FileDescriptorProto
  // and embed it as a string literal, which is parsed and built into real
  // descriptors at initialization time.  We unfortunately have to put it in
  // a string literal, not a byte array, because apparently using a literal
  // byte array causes the Java compiler to generate *instructions* to
  // initialize each and every byte of the array, e.g. as if you typed:
  //   b[0] = 123; b[1] = 456; b[2] = 789;
  // This makes huge bytecode files and can easily hit the compiler's internal
  // code size limits (error "code to large").  String literals are apparently
  // embedded raw, which is what we want.
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);

  std::string file_data;
  file_proto.SerializeToString(&file_data);

  printer->Print("java.lang.String[] descriptorData = {\n");
  printer->Indent();

  // Limit the number of bytes per line.
  static const int kBytesPerLine = 40;
  // Limit the number of lines per string part.
  static const int kLinesPerPart = 400;
  // Every block of bytes, start a new string literal, in order to avoid the
  // 64k length limit. Note that this value needs to be <64k.
  static const int kBytesPerPart = kBytesPerLine * kLinesPerPart;
  for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
    if (i > 0) {
      if (i % kBytesPerPart == 0) {
        printer->Print(",\n");
      } else {
        printer->Print(" +\n");
      }
    }
    printer->Print("\"$data$\"", "data",
                   CEscape(file_data.substr(i, kBytesPerLine)));
  }

  printer->Outdent();
  printer->Print("\n};\n");

  // -----------------------------------------------------------------
  // Find out all dependencies.
  std::vector<std::pair<std::string, std::string> > dependencies;
  for (int i = 0; i < file_->dependency_count(); i++) {
    std::string filename = file_->dependency(i)->name();
    std::string package = FileJavaPackage(file_->dependency(i));
    std::string classname =
        name_resolver_->GetDescriptorClassName(file_->dependency(i));
    std::string full_name;
    if (package.empty()) {
      full_name = classname;
    } else {
      full_name = package + "." + classname;
    }
    dependencies.push_back(std::make_pair(filename, full_name));
  }

  // -----------------------------------------------------------------
  // Invoke internalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = com.google.protobuf.Descriptors.FileDescriptor\n"
      "  .internalBuildGeneratedFileFrom(descriptorData,\n");
  printer->Print(
      "    new com.google.protobuf.Descriptors.FileDescriptor[] {\n");

  for (int i = 0; i < dependencies.size(); i++) {
    const std::string& dependency = dependencies[i].second;
    printer->Print("      $dependency$.getDescriptor(),\n", "dependency",
                   dependency);
  }

  printer->Print("    });\n");
}